

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint readChunk_bKGD(LodePNGInfo *info,uchar *data,size_t chunkLength)

{
  byte bVar1;
  uint uVar2;
  size_t chunkLength_local;
  uchar *data_local;
  LodePNGInfo *info_local;
  
  if ((info->color).colortype == LCT_PALETTE) {
    if (chunkLength != 1) {
      return 0x2b;
    }
    info->background_defined = 1;
    bVar1 = *data;
    info->background_b = (uint)bVar1;
    info->background_g = (uint)bVar1;
    info->background_r = (uint)bVar1;
  }
  else if (((info->color).colortype == LCT_GREY) || ((info->color).colortype == LCT_GREY_ALPHA)) {
    if (chunkLength != 2) {
      return 0x2c;
    }
    info->background_defined = 1;
    uVar2 = (uint)*data * 0x100 + (uint)data[1];
    info->background_b = uVar2;
    info->background_g = uVar2;
    info->background_r = uVar2;
  }
  else if (((info->color).colortype == LCT_RGB) || ((info->color).colortype == LCT_RGBA)) {
    if (chunkLength != 6) {
      return 0x2d;
    }
    info->background_defined = 1;
    info->background_r = (uint)*data * 0x100 + (uint)data[1];
    info->background_g = (uint)data[2] * 0x100 + (uint)data[3];
    info->background_b = (uint)data[4] * 0x100 + (uint)data[5];
  }
  return 0;
}

Assistant:

static unsigned readChunk_bKGD(LodePNGInfo* info, const unsigned char* data, size_t chunkLength)
{
  if(info->color.colortype == LCT_PALETTE)
  {
    /*error: this chunk must be 1 byte for indexed color image*/
    if(chunkLength != 1) return 43;

    info->background_defined = 1;
    info->background_r = info->background_g = info->background_b = data[0];
  }
  else if(info->color.colortype == LCT_GREY || info->color.colortype == LCT_GREY_ALPHA)
  {
    /*error: this chunk must be 2 bytes for greyscale image*/
    if(chunkLength != 2) return 44;

    info->background_defined = 1;
    info->background_r = info->background_g = info->background_b = 256u * data[0] + data[1];
  }
  else if(info->color.colortype == LCT_RGB || info->color.colortype == LCT_RGBA)
  {
    /*error: this chunk must be 6 bytes for greyscale image*/
    if(chunkLength != 6) return 45;

    info->background_defined = 1;
    info->background_r = 256u * data[0] + data[1];
    info->background_g = 256u * data[2] + data[3];
    info->background_b = 256u * data[4] + data[5];
  }

  return 0; /* OK */
}